

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall wallet::WalletBatch::EraseAddressData(WalletBatch *this,CTxDestination *dest)

{
  long lVar1;
  byte bVar2;
  Span<const_std::byte> *this_00;
  long in_FS_OFFSET;
  DataStream prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  DataStream *in_stack_ffffffffffffff68;
  undefined8 local_58;
  undefined8 local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::DataStream((DataStream *)in_stack_ffffffffffffff58);
  DataStream::operator<<
            (in_stack_ffffffffffffff68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  EncodeDestination_abi_cxx11_((CTxDestination *)in_stack_ffffffffffffff68);
  DataStream::operator<<
            (in_stack_ffffffffffffff68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  this_00 = (Span<const_std::byte> *)
            std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
            operator->((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                        *)in_stack_ffffffffffffff58);
  Span<const_std::byte>::Span<DataStream>
            (this_00,(DataStream *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  bVar2 = (**(code **)(this_00->m_data + 0x40))(this_00,local_58,local_50);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseAddressData(const CTxDestination& dest)
{
    DataStream prefix;
    prefix << DBKeys::DESTDATA << EncodeDestination(dest);
    return m_batch->ErasePrefix(prefix);
}